

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_explain_analyze.cpp
# Opt level: O0

SourceResultType __thiscall
duckdb::PhysicalExplainAnalyze::GetData
          (PhysicalExplainAnalyze *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSourceInput *input)

{
  DataChunk *in_RDX;
  ExplainAnalyzeStateGlobalState *gstate;
  Value *in_stack_ffffffffffffff08;
  DataChunk *val;
  GlobalSinkState *in_stack_ffffffffffffff10;
  Value *this_00;
  DataChunk *col_idx;
  DataChunk *this_01;
  string local_d8 [48];
  element_type *in_stack_ffffffffffffff58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff88;
  Value *in_stack_ffffffffffffff90;
  DataChunk local_68;
  ExplainAnalyzeStateGlobalState *local_28;
  DataChunk *local_18;
  
  local_18 = in_RDX;
  unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
  operator->((unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
              *)in_stack_ffffffffffffff10);
  local_28 = GlobalSinkState::Cast<duckdb::ExplainAnalyzeStateGlobalState>
                       (in_stack_ffffffffffffff10);
  this_01 = &local_68;
  col_idx = local_18;
  Value::Value((Value *)in_stack_ffffffffffffff60._M_pi,(char *)in_stack_ffffffffffffff58);
  DataChunk::SetValue(this_01,(idx_t)col_idx,(idx_t)in_stack_ffffffffffffff10,
                      in_stack_ffffffffffffff08);
  Value::~Value((Value *)in_stack_ffffffffffffff10);
  this_00 = (Value *)local_d8;
  val = local_18;
  ::std::__cxx11::string::string((string *)this_00,(string *)&local_28->analyzed_plan);
  Value::Value(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  DataChunk::SetValue(this_01,(idx_t)col_idx,(idx_t)this_00,(Value *)val);
  Value::~Value(this_00);
  ::std::__cxx11::string::~string(local_d8);
  DataChunk::SetCardinality(local_18,1);
  return FINISHED;
}

Assistant:

SourceResultType PhysicalExplainAnalyze::GetData(ExecutionContext &context, DataChunk &chunk,
                                                 OperatorSourceInput &input) const {
	auto &gstate = sink_state->Cast<ExplainAnalyzeStateGlobalState>();

	chunk.SetValue(0, 0, Value("analyzed_plan"));
	chunk.SetValue(1, 0, Value(gstate.analyzed_plan));
	chunk.SetCardinality(1);

	return SourceResultType::FINISHED;
}